

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O1

void test_set_diagonal(GlobalArray *g_a,GlobalArray *g_v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *message;
  double *value;
  ulong uVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  DoubleComplex DVar9;
  int type;
  float fval;
  int ival;
  long lval;
  double dval;
  int vndim;
  int vtype;
  int ndim;
  int vdims [7];
  int dims [7];
  int local_c4;
  undefined4 local_c0;
  int local_bc;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  double local_88;
  double local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_68 [8];
  int local_48 [8];
  
  iVar2 = GA_Nodeid();
  local_bc = -2;
  local_a0 = -2.0;
  local_c0 = 0xc0000000;
  local_a8 = -NAN;
  GA::GlobalArray::inquire(g_a,&local_c4,&local_6c,local_48);
  GA::GlobalArray::inquire(g_v,&local_70,&local_74,local_68);
  local_98 = 0;
  uStack_94 = 0xc0000000;
  uStack_90 = 0;
  uStack_8c = 0x80000000;
  switch(local_c4) {
  case 0x3e9:
    value = (double *)&local_bc;
    break;
  case 0x3ea:
    value = &local_a8;
    break;
  case 0x3eb:
    value = (double *)&local_c0;
    break;
  case 0x3ec:
    value = &local_a0;
    break;
  default:
    GA::GAServices::error((GAServices *)&GA::SERVICES,"test_set_diagonal:wrong data type.",local_c4)
    ;
  case 0x3ef:
    value = (double *)&local_98;
  }
  if (iVar2 == 0) {
    printf("Testing GA_Set_diagonal...");
  }
  GA::GlobalArray::zero(g_a);
  GA::GlobalArray::fill(g_v,value);
  GA::GlobalArray::setDiagonal(g_a,g_v);
  dVar8 = local_a8;
  iVar1 = local_bc;
  switch(local_c4) {
  case 0x3e9:
    iVar3 = GA::GlobalArray::idot(g_a,g_a);
    if (iVar2 != 0) {
      return;
    }
    if (local_68[0] * iVar1 * iVar1 == iVar3) goto LAB_0010625f;
    break;
  case 0x3ea:
    lVar4 = GA::GlobalArray::ldot(g_a,g_a);
    if (iVar2 != 0) {
      return;
    }
    if (local_68[0] * SUB84(dVar8,0) * SUB84(dVar8,0) == (int)lVar4) goto LAB_0010625f;
    break;
  case 0x3eb:
    local_b8 = (double)CONCAT44(local_b8._4_4_,local_c0);
    fVar6 = GA::GlobalArray::fdot(g_a,g_a);
    if (iVar2 != 0) {
      return;
    }
    dVar8 = (double)fVar6;
    dVar7 = (double)((float)local_68[0] * local_b8._0_4_ * local_b8._0_4_);
    goto LAB_0010622c;
  case 0x3ec:
    local_b8 = local_a0;
    dVar8 = GA::GlobalArray::ddot(g_a,g_a);
    if (iVar2 != 0) {
      return;
    }
    dVar7 = (double)local_68[0] * local_b8 * local_b8;
LAB_0010622c:
    dVar7 = dVar7 - dVar8;
    uVar5 = -(ulong)(dVar7 < -dVar7);
    dVar8 = (double)(~uVar5 & (ulong)dVar7 | (ulong)-dVar7 & uVar5);
joined_r0x00106346:
    if (dVar8 < 1e-05) {
LAB_0010625f:
      puts("ok.");
      return;
    }
    break;
  default:
    message = "test_set_diagonal:wrong data type:";
    goto LAB_0010636a;
  case 0x3ef:
    local_b8 = (double)CONCAT44(uStack_94,local_98);
    uStack_b0 = 0;
    local_80 = (double)CONCAT44(uStack_8c,uStack_90);
    local_88 = (double)local_48[0];
    DVar9 = GA::GlobalArray::zdot(g_a,g_a);
    if (iVar2 != 0) {
      return;
    }
    dVar8 = (local_b8 * local_b8 - local_80 * local_80) * (double)local_68[0] - DVar9.real;
    uVar5 = -(ulong)(dVar8 < -dVar8);
    if (1e-05 <= (double)(~uVar5 & (ulong)dVar8 | (ulong)-dVar8 & uVar5)) break;
    dVar8 = (local_b8 + local_b8) * local_80 * local_88 - DVar9.imag;
    uVar5 = -(ulong)(dVar8 < -dVar8);
    dVar8 = (double)(~uVar5 & (ulong)dVar8 | (ulong)-dVar8 & uVar5);
    goto joined_r0x00106346;
  }
  puts("not ok.");
  message = "test_set_diagonal:mismatched.";
LAB_0010636a:
  GA::GAServices::error((GAServices *)&GA::SERVICES,message,local_c4);
}

Assistant:

void 
test_set_diagonal (GA::GlobalArray * g_a, 
		   GA::GlobalArray * g_v)  {
  

  int me = GA_Nodeid ();
  void *val;
  int ival = -2;
  double dval = -2.0;
  float fval = -2.0;
  long lval = -2;
  DoubleComplex dcval;

  int idot, iresult, ldot, lresult;
  double fdot, ddot, fresult, dresult;
  DoubleComplex zdot, zresult;

  int type, ndim, dims[MAXDIM];
  int vtype, vndim, vdims[MAXDIM];

  g_a->inquire (&type, &ndim, dims);
  g_v->inquire (&vtype, &vndim, vdims);
  dcval.real = -2.0;
  dcval.imag = -0.0;

  switch (type)
    {
    case C_INT:
      val = (void *)&ival;
      break;
    case C_DCPL:
      val = (void *)&dcval;
      break;
    case C_DBL:
      val = (void *)&dval;
      break;
    case C_FLOAT:
      val = (void *)&fval;
      break;
    case C_LONG:
      val =(void *) &lval;
      break;
    default:
      GA::SERVICES.error ((char *)"test_set_diagonal:wrong data type.", type);
    }


  if (me == 0)
    printf ("Testing GA_Set_diagonal...");
  g_a->zero ();
  g_v->fill (val);
  g_a->setDiagonal (g_v);

  switch (type)
    {
    case C_INT:
      idot = vdims[0] * ival * ival;
      iresult = g_a->idot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (idot, iresult)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_LONG:
      ldot = ((long) vdims[0]) * lval * lval;
      lresult = g_a->ldot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (ldot, lresult)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_FLOAT:
      fdot = ((float) vdims[0]) * fval * fval;
      fresult = g_a->fdot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (fdot, fresult)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DBL:
      ddot = ((double) vdims[0]) * dval * dval;
      dresult = g_a->ddot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (ddot, dresult)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DCPL:
      zdot.real =
	((double) vdims[0]) * (dcval.real * dcval.real -
			       dcval.imag * dcval.imag);
      zdot.imag = ((double) dims[0]) * (2.0 * dcval.real * dcval.imag);
      zresult = g_a->zdot (g_a);
      if (me == 0)
	{
	  if (MISMATCHED (zdot.real, zresult.real)
	      || MISMATCHED (zdot.imag, zresult.imag)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_set_diagonal:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    default:
      GA::SERVICES.error ((char *)"test_set_diagonal:wrong data type:", type);
    }

}